

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<pstore::small_vector<unsigned_char,128ul>,void>
               (small_vector<unsigned_char,_128UL> *container,ostream *os)

{
  size_t sVar1;
  uchar *puVar2;
  size_t sVar3;
  
  std::operator<<(os,'{');
  sVar1 = container->elements_;
  puVar2 = container->buffer_;
  sVar3 = 0;
  do {
    if (sVar1 == sVar3) {
      if (sVar1 != 0) {
LAB_00134fb7:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((sVar3 != 0) && (std::operator<<(os,','), sVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00134fb7;
    }
    std::operator<<(os,' ');
    UniversalPrinter<unsigned_char>::Print(puVar2 + sVar3,os);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }